

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

HuffmanTreeToken * CodeRepeatedZeros(int repetitions,HuffmanTreeToken *tokens)

{
  int i;
  HuffmanTreeToken *tokens_local;
  int repetitions_local;
  
  tokens_local = tokens;
  repetitions_local = repetitions;
  while( true ) {
    if (repetitions_local < 1) {
      return tokens_local;
    }
    if (repetitions_local < 3) {
      for (i = 0; i < repetitions_local; i = i + 1) {
        tokens_local->code = '\0';
        tokens_local->extra_bits = '\0';
        tokens_local = tokens_local + 1;
      }
      return tokens_local;
    }
    if (repetitions_local < 0xb) {
      tokens_local->code = '\x11';
      tokens_local->extra_bits = (char)repetitions_local + 0xfd;
      return tokens_local + 1;
    }
    if (repetitions_local < 0x8b) break;
    tokens_local->code = '\x12';
    tokens_local->extra_bits = '\x7f';
    tokens_local = tokens_local + 1;
    repetitions_local = repetitions_local + -0x8a;
  }
  tokens_local->code = '\x12';
  tokens_local->extra_bits = (char)repetitions_local + 0xf5;
  return tokens_local + 1;
}

Assistant:

static HuffmanTreeToken* CodeRepeatedZeros(int repetitions,
                                           HuffmanTreeToken* tokens) {
  while (repetitions >= 1) {
    if (repetitions < 3) {
      int i;
      for (i = 0; i < repetitions; ++i) {
        tokens->code = 0;   // 0-value
        tokens->extra_bits = 0;
        ++tokens;
      }
      break;
    } else if (repetitions < 11) {
      tokens->code = 17;
      tokens->extra_bits = repetitions - 3;
      ++tokens;
      break;
    } else if (repetitions < 139) {
      tokens->code = 18;
      tokens->extra_bits = repetitions - 11;
      ++tokens;
      break;
    } else {
      tokens->code = 18;
      tokens->extra_bits = 0x7f;  // 138 repeated 0s
      ++tokens;
      repetitions -= 138;
    }
  }
  return tokens;
}